

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *lib)

{
  bool bVar1;
  string *psVar2;
  cmStateDirectory *this_00;
  string sStack_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)lib);
  this_00 = &this->StateDir;
  psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(this_00);
  bVar1 = cmStateDirectory::ContainsBoth(this_00,psVar2,lib);
  if (bVar1) {
    psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(this_00);
    cmSystemTools::ForceToRelativePath(&sStack_38,psVar2,lib);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  std::string relLib = lib;

  if (this->StateDir.ContainsBoth(this->StateDir.GetCurrentBinary(), lib)) {
    relLib = cmSystemTools::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), lib);
  }
  return relLib;
}